

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void logger_file(char *line)

{
  IOHANDLE io;
  size_t sVar1;
  
  io = logfile;
  sVar1 = strlen(line);
  io_write(io,line,(uint)sVar1);
  io_write_newline(logfile);
  fflush((FILE *)logfile);
  return;
}

Assistant:

static void logger_file(const char *line)
{
	io_write(logfile, line, str_length(line));
	io_write_newline(logfile);
	io_flush(logfile);
}